

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

uint __thiscall Js::JavascriptRegExp::GetSpecialPropertyCount(JavascriptRegExp *this)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ScriptConfiguration *pSVar3;
  undefined4 local_1c;
  uint specialPropertyCount;
  JavascriptRegExp *this_local;
  
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pSVar3 = ScriptContext::GetConfig(pSVar2);
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(pSVar3);
  if (bVar1) {
    this_local._4_4_ = 1;
  }
  else {
    local_1c = 6;
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pSVar3 = ScriptContext::GetConfig(pSVar2);
    bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar3);
    if (bVar1) {
      local_1c = 7;
    }
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pSVar3 = ScriptContext::GetConfig(pSVar2);
    bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(pSVar3);
    if (bVar1) {
      local_1c = local_1c + 1;
    }
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pSVar3 = ScriptContext::GetConfig(pSVar2);
    bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(pSVar3);
    if (bVar1) {
      local_1c = local_1c + 1;
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

uint JavascriptRegExp::GetSpecialPropertyCount() const
    {
        if (GetScriptContext()->GetConfig()->IsES6RegExPrototypePropertiesEnabled())
        {
            return 1; // lastIndex
        }

        uint specialPropertyCount = defaultSpecialPropertyIdsCount;

        if (GetScriptContext()->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            specialPropertyCount += 1;
        }

        if (GetScriptContext()->GetConfig()->IsES6RegExStickyEnabled())
        {
            specialPropertyCount += 1;
        }

        if (GetScriptContext()->GetConfig()->IsES2018RegExDotAllEnabled())
        {
            specialPropertyCount += 1;
        }

        return specialPropertyCount;
    }